

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O0

void aom_wb_write_uvlc(aom_write_bit_buffer *wb,uint32_t v)

{
  int in_ESI;
  int leading_zeroes;
  int64_t shift_val;
  int in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  undefined8 local_18;
  
  local_18 = (ulong)(in_ESI + 1);
  iVar1 = 1;
  while (local_18 = (long)local_18 >> 1, local_18 != 0) {
    iVar1 = iVar1 + 2;
  }
  aom_wb_write_literal
            ((aom_write_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  aom_wb_write_unsigned_literal
            ((aom_write_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void aom_wb_write_uvlc(struct aom_write_bit_buffer *wb, uint32_t v) {
  int64_t shift_val = ++v;
  int leading_zeroes = 1;

  assert(shift_val > 0);

  while (shift_val >>= 1) leading_zeroes += 2;

  aom_wb_write_literal(wb, 0, leading_zeroes >> 1);
  aom_wb_write_unsigned_literal(wb, v, (leading_zeroes + 1) >> 1);
}